

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O2

void __thiscall
ChunkedSequenceResize_TwoElementsDownToOne_Test::TestBody
          (ChunkedSequenceResize_TwoElementsDownToOne_Test *this)

{
  reference lhs;
  char *pcVar1;
  AssertHelper local_80;
  AssertionResult gtest_ar_5;
  const_iterator it;
  AssertHelper local_58;
  cseq_int cs;
  iterator_base<false> local_30;
  iterator_base<false> local_20;
  
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence(&cs);
  it.chunk_it_._M_node._0_4_ = 0x11;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&cs,(int *)&it);
  it.chunk_it_._M_node._0_4_ = 0x13;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&cs,(int *)&it);
  gtest_ar_5._0_8_ =
       cs.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node._M_size;
  local_80.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&it,"cs.chunks_size ()","1U",(unsigned_long *)&gtest_ar_5,(uint *)&local_80
            );
  if ((char)it.chunk_it_._M_node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (it.index_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)it.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x135,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it.index_);
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::resize(&cs,1);
  gtest_ar_5._0_8_ =
       cs.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node._M_size;
  local_80.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&it,"cs.chunks_size ()","1U",(unsigned_long *)&gtest_ar_5,(uint *)&local_80
            );
  if ((char)it.chunk_it_._M_node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (it.index_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)it.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x138,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it.index_);
  gtest_ar_5._0_8_ = cs.size_;
  local_80.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&it,"cs.size ()","1U",(unsigned_long *)&gtest_ar_5,(uint *)&local_80);
  if ((char)it.chunk_it_._M_node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (it.index_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)it.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x139,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it.index_);
  local_20.chunk_it_._M_node =
       cs.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_20.index_ = 0;
  pstore::chunked_sequence<int,2ul,4ul,4ul>::
  end_impl<pstore::chunked_sequence<int,2ul,4ul,4ul>,pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
            ((chunked_sequence<int,2ul,4ul,4ul> *)&local_30,&cs);
  gtest_ar_5._0_8_ =
       std::distance<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>
                 (&local_20,&local_30);
  local_80.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<long,unsigned_int>
            ((internal *)&it,"std::distance (std::begin (cs), std::end (cs))","1U",
             (long *)&gtest_ar_5,(uint *)&local_80);
  if ((char)it.chunk_it_._M_node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (it.index_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)it.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it.index_);
  gtest_ar_5._0_8_ =
       cs.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node._M_size * 2;
  local_80.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&it,"cs.capacity ()","2U",(unsigned_long *)&gtest_ar_5,(uint *)&local_80);
  if ((char)it.chunk_it_._M_node == '\0') {
    testing::Message::Message((Message *)&gtest_ar_5);
    if (it.index_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)it.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_5);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_5._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_5._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&it.index_);
  it.chunk_it_._M_node =
       cs.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  it.index_ = 0;
  lhs = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*(&it);
  local_80.data_._0_4_ = 0x11;
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_5,"*it","17",lhs,(int *)&local_80);
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    std::operator<<((ostream *)&(local_80.data_)->line,"Element 0 (chunk 0, index 0)");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x13e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  gtest_ar_5._0_4_ = 0x17;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&cs,(int *)&gtest_ar_5);
  local_80.data_ = (AssertHelperData *)&DAT_1100000017;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(&gtest_ar_5,(char *)&local_80,(chunked_sequence<int,_2UL,_4UL,_4UL> *)"cs");
  if (gtest_ar_5.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_5.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x141,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_80.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_80.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_5.message_);
  std::__cxx11::
  _List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
  ::_M_clear((_List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
              *)&cs);
  return;
}

Assistant:

TEST (ChunkedSequenceResize, TwoElementsDownToOne) {
    cseq_int cs;
    cs.emplace_back (17);
    cs.emplace_back (19);
    // Before: [ 17, 19 ]
    EXPECT_EQ (cs.chunks_size (), 1U);
    // After: [ 17, _ ]
    cs.resize (1U);
    EXPECT_EQ (cs.chunks_size (), 1U);
    EXPECT_EQ (cs.size (), 1U);
    EXPECT_EQ (std::distance (std::begin (cs), std::end (cs)), 1U);
    EXPECT_EQ (cs.capacity (), 2U);

    cseq_int::const_iterator it = cs.begin ();
    EXPECT_EQ (*it, 17) << "Element 0 (chunk 0, index 0)";

    cs.emplace_back (23);
    EXPECT_THAT (cs, testing::ElementsAre (17, 23));
}